

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

Real amrex::Amr::computeOptimalSubcycling
               (int n,int *best,Real *dt_max,Real *est_work,int *cycle_max)

{
  int i;
  long lVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int i_1;
  size_type __n;
  double dVar7;
  Real RVar8;
  Real RVar9;
  double dVar10;
  double dVar11;
  allocator_type local_51;
  Real local_50;
  vector<int,_std::allocator<int>_> cycles;
  
  __n = (size_type)n;
  std::vector<int,_std::allocator<int>_>::vector(&cycles,__n,&local_51);
  iVar4 = 1;
  for (lVar1 = 1; lVar1 < (long)__n; lVar1 = lVar1 + 1) {
    iVar4 = iVar4 * cycle_max[lVar1];
  }
  uVar2 = 0;
  uVar6 = 0;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  dVar7 = 1e+200;
  local_50 = 0.0;
  while (iVar5 = (int)uVar2, iVar5 != iVar4) {
    *cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         1;
    RVar9 = *dt_max;
    RVar8 = *est_work;
    for (lVar1 = 1; lVar1 < (long)__n; lVar1 = lVar1 + 1) {
      iVar3 = ((int)uVar2 % cycle_max[lVar1] + 1) *
              cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar1 + -1];
      cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar1] = iVar3;
      dVar10 = (double)iVar3;
      dVar11 = dt_max[lVar1] * dVar10;
      if (RVar9 <= dVar11) {
        dVar11 = RVar9;
      }
      RVar9 = dVar11;
      RVar8 = RVar8 + dVar10 * est_work[lVar1];
      uVar2 = (long)(int)uVar2 / (long)cycle_max[lVar1] & 0xffffffff;
    }
    if (RVar8 / RVar9 < dVar7) {
      for (uVar2 = 0; dVar7 = RVar8 / RVar9, local_50 = RVar9, uVar6 != uVar2; uVar2 = uVar2 + 1) {
        best[uVar2] = cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar2];
      }
    }
    uVar2 = (ulong)(iVar5 + 1);
  }
  for (uVar2 = (ulong)(uint)n; 1 < (int)uVar2; uVar2 = uVar2 - 1) {
    best[uVar2 - 1] = best[uVar2 - 1] / best[uVar2 - 2];
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&cycles.super__Vector_base<int,_std::allocator<int>_>);
  return local_50;
}

Assistant:

Real
Amr::computeOptimalSubcycling(int n, int* best, Real* dt_max, Real* est_work, int* cycle_max)
{
    BL_ASSERT(cycle_max[0] == 1);
    // internally these represent the total number of steps at a level,
    // not the number of cycles
    std::vector<int> cycles(n);
#ifdef AMREX_USE_FLOAT
    Real best_ratio = 1e30f;
#else
    Real best_ratio = 1e200;
#endif
    Real best_dt = 0;
    Real ratio;
    Real dt;
    Real work;
    int limit = 1;
    // This provides a memory efficient way to test all candidates
    for (int i = 1; i < n; i++)
        limit *= cycle_max[i];
    for (int candidate = 0; candidate < limit; candidate++)
    {
        int temp_cand = candidate;
        cycles[0] = 1;
        dt = dt_max[0];
        work = est_work[0];
        for (int i  = 1; i < n; i++)
        {
            // grab the relevant "digit" and shift over.
            cycles[i] = (1 + temp_cand%cycle_max[i]) * cycles[i-1];
            temp_cand /= cycle_max[i];
            dt = std::min(dt, cycles[i]*dt_max[i]);
            work += cycles[i]*est_work[i];
        }
        ratio = work/dt;
        if (ratio < best_ratio)
        {
            for (int i  = 0; i < n; i++)
                best[i] = cycles[i];
            best_ratio = ratio;
            best_dt = dt;
        }
    }
    //
    // Now we convert best back to n_cycles format
    //
    for (int i = n-1; i > 0; i--)
        best[i] /= best[i-1];
    return best_dt;
}